

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O3

ShapeRange * __thiscall
CoreML::ShapeRange::intersect(ShapeRange *__return_storage_ptr__,ShapeRange *this,ShapeRange *other)

{
  RangeValue *pRVar1;
  ulong uVar2;
  byte bVar3;
  size_t sVar4;
  runtime_error *this_00;
  ShapeRange *pSVar5;
  stringstream ss;
  string asStack_1d8 [32];
  ShapeRange local_1b8 [12];
  
  ShapeRange(__return_storage_ptr__);
  local_1b8[0]._minimum._isUnbound = (other->_minimum)._isUnbound;
  local_1b8[0]._minimum._val = (other->_minimum)._val;
  if ((local_1b8[0]._minimum._isUnbound & 1U) == 0) {
    pSVar5 = this;
    if (((this->_minimum)._isUnbound != true) &&
       (uVar2 = (this->_minimum)._val, sVar4 = RangeValue::value(&local_1b8[0]._minimum),
       uVar2 <= sVar4)) {
      local_1b8[0]._minimum._isUnbound = (other->_minimum)._isUnbound;
      local_1b8[0]._minimum._val = (other->_minimum)._val;
      goto LAB_0025d590;
    }
  }
  else {
LAB_0025d590:
    pSVar5 = local_1b8;
  }
  setLower(__return_storage_ptr__,&pSVar5->_minimum);
  pRVar1 = &this->_maximum;
  local_1b8[0]._minimum._isUnbound = (other->_maximum)._isUnbound;
  local_1b8[0]._minimum._val = (other->_maximum)._val;
  if ((this->_maximum)._isUnbound == true) {
LAB_0025d5e3:
    pSVar5 = local_1b8;
  }
  else {
    pSVar5 = (ShapeRange *)pRVar1;
    if (((local_1b8[0]._minimum._isUnbound & 1U) == 0) &&
       (uVar2 = (this->_maximum)._val, sVar4 = RangeValue::value(&local_1b8[0]._minimum),
       sVar4 <= uVar2)) {
      local_1b8[0]._minimum._isUnbound = (other->_maximum)._isUnbound;
      local_1b8[0]._minimum._val = (other->_maximum)._val;
      goto LAB_0025d5e3;
    }
  }
  setUpper(__return_storage_ptr__,&pSVar5->_minimum);
  if ((this->_minimum)._isUnbound == false) {
    bVar3 = 0;
    if (pRVar1->_isUnbound == false) {
      uVar2 = (this->_minimum)._val;
      sVar4 = RangeValue::value(pRVar1);
      if (sVar4 < uVar2) goto LAB_0025d667;
      bVar3 = (this->_minimum)._isUnbound;
    }
    if ((bVar3 & 1) == 0) {
      return __return_storage_ptr__;
    }
  }
LAB_0025d667:
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  pRVar1 = &local_1b8[0]._maximum;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pRVar1,"Invalid intersection between ",0x1d);
  ::operator<<((ostream *)pRVar1,this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pRVar1," and ",5);
  ::operator<<((ostream *)pRVar1,other);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,asStack_1d8);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ShapeRange ShapeRange::intersect(const ShapeRange& other) const {

    // These routines will throw if it's invalid (i.e. max < min)
    ShapeRange out;
    if (_minimum <= other.minimum())
        out.setLower(other.minimum());
    else {
        out.setLower(_minimum);
    }

    if (_maximum >= other.maximum())
        out.setUpper(other.maximum());
    else {
        out.setUpper(_maximum);
    }

    if (_minimum > _maximum || _minimum.isUnbound()) {
        std::stringstream ss;
        ss << "Invalid intersection between " << *this << " and " << other;
        throw std::runtime_error(ss.str());
    }

    return out;

}